

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O0

void elf32_dyncreate(GlobalVars *gv,char *pltgot_name)

{
  Section *relsec;
  uint8_t *puVar1;
  Section *pSVar2;
  GlobalVars *in_RSI;
  ObjectUnit *in_RDI;
  LibPath *lpn;
  Section *pltgot;
  Section *dynsym;
  Section *dynstr;
  char *fn;
  char *in_stack_ffffffffffffffb0;
  ObjectUnit *name;
  ObjectUnit *in_stack_ffffffffffffffb8;
  ObjectUnit *in_stack_ffffffffffffffc0;
  long *local_38;
  Section *in_stack_ffffffffffffffe0;
  char *pcVar3;
  uint32_t tag;
  
  pcVar3 = "elf32_dyncreate():";
  if (in_RDI[3].stabs.last == (node *)0x0) {
    ierror("%s no dynobj","elf32_dyncreate():");
  }
  if ((in_RDI[1].pripointers.dummy != (node *)0x0) && (*(int *)&(in_RDI->stabs).last != 0)) {
    in_stack_ffffffffffffffc0 = in_RDI;
    elf_adddynstr((char *)0x12afc1);
    elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,
                       in_stack_ffffffffffffffe0);
  }
  for (local_38 = *(long **)&in_RDI[1].flags; *local_38 != 0; local_38 = (long *)*local_38) {
    in_stack_ffffffffffffffb8 = in_RDI;
    elf_adddynstr((char *)0x12b00a);
    elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,
                       in_stack_ffffffffffffffe0);
  }
  elf32_makehash(in_RSI);
  relsec = find_sect_name(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (relsec == (Section *)0x0) {
    ierror("%s %s missing",pcVar3,".dynstr");
  }
  else {
    relsec->size = (ulong)elfdstrlist.nextindex;
    puVar1 = (uint8_t *)alloc((size_t)in_stack_ffffffffffffffb0);
    relsec->data = puVar1;
    elf_putstrtab((uint8_t *)in_stack_ffffffffffffffc0,(StrTabList *)in_stack_ffffffffffffffb8);
  }
  pSVar2 = find_sect_name(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (pSVar2 == (Section *)0x0) {
    ierror("%s %s missing",pcVar3,".dynsym");
  }
  else {
    pSVar2->size = (ulong)elfdsymlist.nextindex << 4;
    puVar1 = (uint8_t *)alloc((size_t)in_stack_ffffffffffffffb0);
    pSVar2->data = puVar1;
  }
  name = in_RDI;
  find_sect_name(in_stack_ffffffffffffffb8,(char *)in_RDI);
  elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,relsec);
  elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,relsec);
  elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,relsec);
  elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,relsec);
  elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,relsec);
  elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,relsec);
  pSVar2 = find_sect_name(in_stack_ffffffffffffffb8,(char *)name);
  if (pSVar2 != (Section *)0x0) {
    elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,relsec);
  }
  if (elfpltrelocs != (Section *)0x0) {
    elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,relsec);
    elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,relsec);
    elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,relsec);
  }
  if (elfdynrelocs != (Section *)0x0) {
    tag = (uint32_t)((ulong)pcVar3 >> 0x20);
    if (*(char *)((long)&(in_RDI->pripointers).last + 2) == '\x02') {
      elf32_dynamicentry(in_RSI,tag,(uint32_t)pcVar3,relsec);
      elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,relsec);
      elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,relsec);
    }
    else {
      elf32_dynamicentry(in_RSI,tag,(uint32_t)pcVar3,relsec);
      elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,relsec);
      elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,relsec);
    }
  }
  elf32_dynamicentry(in_RSI,(uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,relsec);
  return;
}

Assistant:

void elf32_dyncreate(struct GlobalVars *gv,const char *pltgot_name)
/* generate .hash, populate .dynstr and .dynamic, allocate .dynsym,
   so that all sections have a valid size for the address calculation */
{
  const char *fn = "elf32_dyncreate():";
  struct Section *dynstr,*dynsym,*pltgot;
  struct LibPath *lpn;

  if (gv->dynobj == NULL)
    ierror("%s no dynobj",fn);

  /* write SONAME and RPATHs */
  if (gv->soname && gv->dest_sharedobj)
    elf32_dynamicentry(gv,DT_SONAME,elf_adddynstr(gv->soname),NULL);
  for (lpn=(struct LibPath *)gv->rpaths.first; lpn->n.next!=NULL;
       lpn=(struct LibPath *)lpn->n.next) {
    elf32_dynamicentry(gv,DT_RPATH,elf_adddynstr(lpn->path),NULL);
  }

  /* generate .hash section */
  elf32_makehash(gv);

  /* allocate and populate .dynstr section */
  if (dynstr = find_sect_name(gv->dynobj,dynstr_name)) {
    dynstr->size = elfdstrlist.nextindex;
    dynstr->data = alloc(dynstr->size);
    elf_putstrtab(dynstr->data,&elfdstrlist);
  }
  else
    ierror("%s %s missing",fn,dynstr_name);

  /* allocate .dynsym section - populate it later, when addresses are fixed */
  if (dynsym = find_sect_name(gv->dynobj,dynsym_name)) {
    dynsym->size = elfdsymlist.nextindex * sizeof(struct Elf32_Sym);
    dynsym->data = alloc(dynsym->size);
  }
  else
    ierror("%s %s missing",fn,dynsym_name);

  /* finish .dynamic section */
  elf32_dynamicentry(gv,DT_HASH,0,find_sect_name(gv->dynobj,hash_name));
  elf32_dynamicentry(gv,DT_STRTAB,0,dynstr);
  elf32_dynamicentry(gv,DT_SYMTAB,0,dynsym);
  elf32_dynamicentry(gv,DT_STRSZ,dynstr->size,NULL);
  elf32_dynamicentry(gv,DT_SYMENT,sizeof(struct Elf32_Sym),NULL);
  elf32_dynamicentry(gv,DT_DEBUG,0,NULL); /* needed? */
  /* do we have a .plt or .got section (target dependant) */
  if (pltgot = find_sect_name(gv->dynobj,pltgot_name)) {
    elf32_dynamicentry(gv,DT_PLTGOT,0,pltgot);    
  }
  /* do we have .plt relocations? */
  if (elfpltrelocs) {
    elf32_dynamicentry(gv,DT_PLTRELSZ,elfpltrelocs->size,NULL);
    elf32_dynamicentry(gv,DT_PLTREL,
                       gv->reloctab_format==RTAB_ADDEND?DT_RELA:DT_REL,
                       NULL);
    elf32_dynamicentry(gv,DT_JMPREL,0,elfpltrelocs);
  }
  /* do we have any other dynamic relocations? */
  if (elfdynrelocs) {
    if (gv->reloctab_format == RTAB_ADDEND) {
      elf32_dynamicentry(gv,DT_RELA,0,elfdynrelocs);
      elf32_dynamicentry(gv,DT_RELASZ,elfdynrelocs->size,NULL);
      elf32_dynamicentry(gv,DT_RELAENT,sizeof(struct Elf32_Rela),NULL);
    }
    else {
      elf32_dynamicentry(gv,DT_REL,0,elfdynrelocs);
      elf32_dynamicentry(gv,DT_RELSZ,elfdynrelocs->size,NULL);
      elf32_dynamicentry(gv,DT_RELENT,sizeof(struct Elf32_Rel),NULL);
    }
  }
  /* end tag */
  elf32_dynamicentry(gv,DT_NULL,0,NULL);
}